

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry.cpp
# Opt level: O0

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  undefined8 *in_RDI;
  int in_stack_00001384;
  string *in_stack_00001388;
  SceneLoadingTutorialApplication *in_stack_00001390;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"hair_geometry",&local_29);
  SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
            (in_stack_00001390,in_stack_00001388,in_stack_00001384);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *in_RDI = &PTR__Tutorial_006065e0;
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES) {}